

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O1

vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
* __thiscall
pfederc::Parser::parseFuncParameters
          (vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           *__return_storage_ptr__,Parser *this)

{
  Token *pTVar1;
  size_t sVar2;
  pointer puVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  __uniq_ptr_impl<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  _Var9;
  vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  *pvVar10;
  uint uVar11;
  unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  funcparam;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  undefined1 local_80 [24];
  Error<pfederc::SyntaxErrorCode> *local_68;
  vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  *local_60;
  vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  local_58;
  undefined1 local_40 [16];
  
  sanityExpect(this,TOK_OP_BRACKET_OPEN);
  bVar8 = Token::operator==(this->lexer->currentToken,TOK_BRACKET_CLOSE);
  if (bVar8) {
    pTVar1 = this->lexer->currentToken;
    local_58.
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
    sVar4 = (pTVar1->pos).line;
    sVar5 = (pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    ((Error<pfederc::SyntaxErrorCode> *)
    local_58.
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
    ((Error<pfederc::SyntaxErrorCode> *)
    local_58.
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_PARAMETERS;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_58.
     super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).line = sVar4;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_58.
     super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).startIndex = sVar5;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_58.
     super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).endIndex = sVar2;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_58.
     super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_58.
     super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_58.
     super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)(local_40 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_40 + 8));
    if ((Error<pfederc::SyntaxErrorCode> *)
        local_58.
        super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_58,
                 (Error<pfederc::SyntaxErrorCode> *)
                 local_58.
                 super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_58.
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
          *)0x0;
    local_58.
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80._20_4_ = 0;
    local_60 = __return_storage_ptr__;
    parseExpression((Parser *)(local_80 + 8),(Precedence)this);
    do {
      uVar6 = local_80._8_8_;
      if (*(int *)(local_80._8_8_ + 0x18) != 0x12) break;
      if ((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
             *)local_80._8_8_)->
          super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          )._M_t.
          super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl !=
          (Error<pfederc::SyntaxErrorCode> *)&PTR__BiOpExpr_00128998) {
        __cxa_bad_cast();
      }
      if (*(short *)(local_80._8_8_ + 0x40) != 0x2e) break;
      if ((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
             *)local_80._8_8_)->
          super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          )._M_t.
          super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl !=
          (Error<pfederc::SyntaxErrorCode> *)&PTR__BiOpExpr_00128998) {
        __cxa_bad_cast();
      }
      local_68 = *(Error<pfederc::SyntaxErrorCode> **)(local_80._8_8_ + 0x50);
      *(undefined8 *)(local_80._8_8_ + 0x50) = 0;
      _Var9._M_t.
      super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
      .
      super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
      ._M_head_impl =
           (tuple<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
            )fromExprToFunctionParam
                       ((Parser *)local_80,
                        (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
      if (local_68 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
        _Var9._M_t.
        super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
        .
        super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
        ._M_head_impl =
             (tuple<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
              )(**(code **)(*(long *)local_68 + 8))();
      }
      uVar7 = local_80._0_8_;
      if ((tuple<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
           )local_80._0_8_ ==
          (_Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
           )0x0) {
        local_80._20_4_ =
             (undefined4)
             CONCAT71(_Var9._M_t.
                      super__Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                      .
                      super__Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
                      ._M_head_impl._1_7_,1);
        puVar3 = (pointer)local_80._8_8_;
      }
      else {
        std::
        vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
        ::_M_insert_rval(&local_58,
                         (const_iterator)
                         local_58.
                         super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_80);
        puVar3 = *(pointer *)(uVar6 + 0x48);
        *(undefined8 *)(uVar6 + 0x48) = 0;
        if ((pointer)local_80._8_8_ != (pointer)0x0) {
          uVar6 = local_80._8_8_;
          local_80._8_8_ = puVar3;
          (**(code **)((long)*(__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                               *)uVar6 + 8))();
          puVar3 = (pointer)local_80._8_8_;
        }
      }
      local_80._8_8_ = puVar3;
      if ((_Tuple_impl<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
           )local_80._0_8_ !=
          (tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
           *)0x0) {
        std::
        default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::operator()((default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                      *)local_80,
                     (tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                      *)local_80._0_8_);
      }
    } while ((_Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
              )uVar7 !=
             (_Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
              )0x0);
    fromExprToFunctionParam
              ((Parser *)local_80,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
    if ((Lexer *)local_80._0_8_ == (Lexer *)0x0) {
      uVar11 = 1;
    }
    else {
      std::
      vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
      ::_M_insert_rval(&local_58,
                       (const_iterator)
                       local_58.
                       super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_80);
      uVar11 = local_80._20_4_;
    }
    __return_storage_ptr__ = local_60;
    bVar8 = expect(this,TOK_BRACKET_CLOSE);
    if (!bVar8) {
      pTVar1 = this->lexer->currentToken;
      local_68 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
      sVar4 = (pTVar1->pos).line;
      sVar5 = (pTVar1->pos).startIndex;
      sVar2 = (pTVar1->pos).endIndex;
      local_68->logLevel = LVL_ERROR;
      local_68->err = STX_ERR_EXPECTED_CLOSING_BRACKET;
      (local_68->pos).line = sVar4;
      (local_68->pos).startIndex = sVar5;
      (local_68->pos).endIndex = sVar2;
      (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generateError((Parser *)local_40,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_40);
      if (local_68 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,local_68);
      }
      uVar11 = 1;
      __return_storage_ptr__ = local_60;
    }
    pvVar10 = __return_storage_ptr__;
    if ((uVar11 & 1) == 0) {
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           local_58.
           super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58.
           super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar10 = &local_58;
    }
    (pvVar10->
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar10->
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar10->
    super__Vector_base<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((_Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
         )local_80._0_8_ !=
        (_Head_base<0UL,_std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_*,_false>
         )0x0) {
      std::
      default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::operator()((default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)local_80,
                   (tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>
                    *)local_80._0_8_);
    }
    if ((pointer)local_80._8_8_ != (pointer)0x0) {
      (*(code *)(((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                     *)local_80._8_8_)->
                  super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                  )._M_t.
                  super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                  .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
                 _M_head_impl)->pos).line)();
    }
    std::
    vector<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<FuncParameter>> Parser::parseFuncParameters() noexcept {
  sanityExpect(TokenType::TOK_OP_BRACKET_OPEN);

  if (*lexer.getCurrentToken() == TokenType::TOK_BRACKET_CLOSE) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_PARAMETERS, lexer.getCurrentToken()->getPosition()));
    return std::vector<std::unique_ptr<FuncParameter>>();
  }

  bool err = false;
  std::vector<std::unique_ptr<FuncParameter>> parameters;

  std::unique_ptr<Expr> expr(parseExpression());
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    auto funcparam = fromExprToFunctionParam(biopexpr.getRightPtr());
    if (!funcparam) {
      err = true;
      break;
    }

    parameters.insert(parameters.begin(), std::move(funcparam));
    // reduce
    expr = biopexpr.getLeftPtr();
  }

  auto funcparam = fromExprToFunctionParam(std::move(expr));
  if (!funcparam)
    err = true;
  else
    parameters.insert(parameters.begin(), std::move(funcparam));

  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    err = true;
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition()));
  }

  if (err)
    return std::vector<std::unique_ptr<FuncParameter>>();

  return parameters;
}